

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O3

object * make_gold(wchar_t lev,char *coin_type)

{
  bool bVar1;
  uint32_t uVar2;
  object *obj;
  object_kind *k;
  wchar_t wVar3;
  wchar_t value;
  
  uVar2 = Rand_div(lev * 2 + 0x15);
  value = ((lev << 4) / 10 - lev) + uVar2 + L'\x06';
  obj = (object *)mem_zalloc(0x138);
  uVar2 = Rand_div(100);
  if ((uVar2 == 0) && (wVar3 = value, value < L'್')) {
    do {
      value = wVar3 * 10;
      uVar2 = Rand_div(100);
      if (uVar2 != 0) break;
      bVar1 = wVar3 < L'ň';
      wVar3 = value;
    } while (bVar1);
  }
  k = money_kind(coin_type,value);
  object_prep(obj,k,lev,RANDOMISE);
  wVar3 = value;
  if (((player->opts).opt[0x26] == true) && (wVar3 = value * 5, player->depth == 0)) {
    wVar3 = value;
  }
  if (L'翾' < wVar3) {
    uVar2 = Rand_div(200);
    wVar3 = L'翿' - uVar2;
  }
  obj->pval = (int16_t)wVar3;
  return obj;
}

Assistant:

struct object *make_gold(int lev, const char *coin_type)
{
	/* This average is 16 at dlev0, 80 at dlev40, 176 at dlev100. */
	int avg = (16 * lev)/10 + 16;
	int spread = lev + 10;
	int value = rand_spread(avg, spread);
	struct object *new_gold = mem_zalloc(sizeof(*new_gold)); 

	/* Increase the range to infinite, moving the average to 110% */
	while (one_in_(100) && value * 10 <= SHRT_MAX)
		value *= 10;

	/* Prepare a gold object */
	object_prep(new_gold, money_kind(coin_type, value), lev, RANDOMISE);

	/* If we're playing with no_selling, increase the value */
	if (OPT(player, birth_no_selling) && player->depth)	{
		value *= 5;
	}

	/* Cap gold at max short (or alternatively make pvals int32_t) */
	if (value >= SHRT_MAX) {
		value = SHRT_MAX - randint0(200);
	}

	new_gold->pval = value;

	return new_gold;
}